

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O0

string * __thiscall FeatureVec::toString_abi_cxx11_(FeatureVec *this)

{
  ulong uVar1;
  size_type sVar2;
  vector<float,_std::allocator<float>_> *in_RSI;
  char *pcVar3;
  string *in_RDI;
  size_t f;
  string *str;
  ulong in_stack_ffffffffffffff88;
  string local_40 [32];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_20 = 0; uVar1 = local_20,
      sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI), uVar1 < sVar2;
      local_20 = local_20 + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_20);
    std::__cxx11::to_string((float)(in_stack_ffffffffffffff88 >> 0x20));
    std::__cxx11::string::operator+=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
    in_stack_ffffffffffffff88 = local_20;
    sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    pcVar3 = "";
    if (in_stack_ffffffffffffff88 < sVar2 - 1) {
      pcVar3 = ", ";
    }
    std::__cxx11::string::operator+=((string *)in_RDI,pcVar3);
  }
  return in_RDI;
}

Assistant:

std::string FeatureVec::toString() {
  std::string str;
  for (size_t f = 0; f < values.size(); f++) {
    str += std::to_string(values[f]);
    str += f < values.size() - 1 ? ", " : "";
  }
  return str;
}